

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

string * __thiscall
flatbuffers::dart::DartGenerator::NamespaceAliasFromUnionType_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Namespace *root_namespace,Type *type)

{
  size_type *psVar1;
  byte bVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  pointer pbVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string ns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  qualified_name_parts;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Type *local_40;
  string *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,&((type->struct_def->super_Definition).defined_namespace)->components);
  bVar4 = std::__equal<false>::equal<std::__cxx11::string*,std::__cxx11::string_const*>
                    ((root_namespace->components).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (root_namespace->components).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     local_58.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar4) {
    (*(this->namer_).super_Namer._vptr_Namer[0xf])
              (__return_storage_ptr__,&this->namer_,type->struct_def);
    goto LAB_001d757b;
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_40 = type;
  local_38 = __return_storage_ptr__;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar7->_M_string_length != 0) {
        uVar8 = 0;
        do {
          if ((uVar8 != 0) &&
             (bVar2 = (pbVar7->_M_dataplus)._M_p[uVar8], 9 < (int)(char)bVar2 - 0x30U)) {
            iVar5 = toupper((uint)bVar2);
            if (bVar2 == (byte)iVar5) {
              std::__cxx11::string::append((char *)&local_78);
            }
          }
          tolower((uint)(byte)(pbVar7->_M_dataplus)._M_p[uVar8]);
          std::__cxx11::string::push_back((char)&local_78);
          uVar8 = uVar8 + 1;
        } while (uVar8 < pbVar7->_M_string_length);
      }
      if (pbVar7 != local_58.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1) {
        std::__cxx11::string::append((char *)&local_78);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_58.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_78,local_78 + local_70);
  std::__cxx11::string::append((char *)&local_b8);
  __return_storage_ptr__ = local_38;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_98,&this->namer_,local_40->struct_def);
  uVar8 = 0xf;
  if (local_b8 != local_a8) {
    uVar8 = local_a8[0];
  }
  if (uVar8 < (ulong)(local_90 + local_b0)) {
    uVar8 = 0xf;
    if (local_98 != local_88) {
      uVar8 = local_88[0];
    }
    if (uVar8 < (ulong)(local_90 + local_b0)) goto LAB_001d74d0;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_001d74d0:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar3 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
LAB_001d757b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespaceAliasFromUnionType(Namespace *root_namespace,
                                          const Type &type) {
    const std::vector<std::string> qualified_name_parts =
        type.struct_def->defined_namespace->components;
    if (std::equal(root_namespace->components.begin(),
                   root_namespace->components.end(),
                   qualified_name_parts.begin())) {
      return namer_.Type(*type.struct_def);
    }

    std::string ns;

    for (auto it = qualified_name_parts.begin();
         it != qualified_name_parts.end(); ++it) {
      auto &part = *it;

      for (size_t i = 0; i < part.length(); i++) {
        if (i && !isdigit(part[i]) && part[i] == CharToUpper(part[i])) {
          ns += "_";
          ns += CharToLower(part[i]);
        } else {
          ns += CharToLower(part[i]);
        }
      }
      if (it != qualified_name_parts.end() - 1) { ns += "_"; }
    }

    return ns + "." + namer_.Type(*type.struct_def);
  }